

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceEngine.cpp
# Opt level: O0

void __thiscall Inferences::CompositeSGI::~CompositeSGI(CompositeSGI *this)

{
  void *in_RDI;
  CompositeSGI *in_stack_00000060;
  
  ~CompositeSGI(in_stack_00000060);
  ::operator_delete(in_RDI,0x50);
  return;
}

Assistant:

CompositeSGI::~CompositeSGI() {
  for (auto gen : _generators) {
    delete gen;
  }
  for (auto simpl : _simplifiers) {
    delete simpl;
  }
}